

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_reduceIndex(ZSTD_CCtx *zc,U32 reducerValue)

{
  U32 size;
  U32 h3Size;
  U32 chainSize;
  U32 hSize;
  ZSTD_matchState_t *ms;
  U32 reducerValue_local;
  ZSTD_CCtx *zc_local;
  
  ZSTD_reduceTable((zc->blockState).matchState.hashTable,
                   1 << ((byte)(zc->appliedParams).cParams.hashLog & 0x1f),reducerValue);
  if ((zc->appliedParams).cParams.strategy != ZSTD_fast) {
    size = 1 << ((byte)(zc->appliedParams).cParams.chainLog & 0x1f);
    if ((zc->appliedParams).cParams.strategy == ZSTD_btlazy2) {
      ZSTD_reduceTable_btlazy2((zc->blockState).matchState.chainTable,size,reducerValue);
    }
    else {
      ZSTD_reduceTable((zc->blockState).matchState.chainTable,size,reducerValue);
    }
  }
  if ((zc->blockState).matchState.hashLog3 != 0) {
    ZSTD_reduceTable((zc->blockState).matchState.hashTable3,
                     1 << ((byte)(zc->blockState).matchState.hashLog3 & 0x1f),reducerValue);
  }
  return;
}

Assistant:

static void ZSTD_reduceIndex (ZSTD_CCtx* zc, const U32 reducerValue)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    {   U32 const hSize = (U32)1 << zc->appliedParams.cParams.hashLog;
        ZSTD_reduceTable(ms->hashTable, hSize, reducerValue);
    }

    if (zc->appliedParams.cParams.strategy != ZSTD_fast) {
        U32 const chainSize = (U32)1 << zc->appliedParams.cParams.chainLog;
        if (zc->appliedParams.cParams.strategy == ZSTD_btlazy2)
            ZSTD_reduceTable_btlazy2(ms->chainTable, chainSize, reducerValue);
        else
            ZSTD_reduceTable(ms->chainTable, chainSize, reducerValue);
    }

    if (ms->hashLog3) {
        U32 const h3Size = (U32)1 << ms->hashLog3;
        ZSTD_reduceTable(ms->hashTable3, h3Size, reducerValue);
    }
}